

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  uint uVar2;
  char *__s;
  long lVar3;
  size_t sVar4;
  uint *puVar5;
  long lVar6;
  long *plVar7;
  undefined8 *puVar8;
  Image2D *this;
  time_t __seedval;
  Object *list;
  undefined8 uVar9;
  ulong *puVar10;
  Scene *pSVar11;
  size_type *psVar12;
  int width;
  Scene *__endptr;
  ulong uVar13;
  int height;
  Scene _scene;
  Camera _camera;
  string _type;
  string _name;
  allocator local_23c;
  allocator local_23b;
  allocator local_23a;
  allocator local_239;
  undefined1 local_238 [16];
  ulong local_228;
  long lStack_220;
  undefined1 local_218 [16];
  undefined8 local_208;
  undefined8 uStack_200;
  long local_1f8;
  Scene local_1f0;
  undefined1 local_1c0 [16];
  ulong local_1b0;
  long lStack_1a8;
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  ulong *local_180;
  long local_178;
  ulong local_170;
  long lStack_168;
  undefined1 local_160 [16];
  Scene local_150;
  string local_100;
  long local_e0;
  long local_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (argc < 5) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x123268);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," width height samples filename\n",0x1f);
    return 1;
  }
  std::__cxx11::string::string((string *)local_160,argv[1],(allocator *)&local_100);
  uVar9 = local_160._0_8_;
  puVar5 = (uint *)__errno_location();
  uVar2 = *puVar5;
  __endptr = (Scene *)(ulong)uVar2;
  *puVar5 = 0;
  lVar6 = strtol((char *)uVar9,(char **)&local_1f0,10);
  if (local_1f0.m_materials == (Material **)uVar9) {
    std::__throw_invalid_argument("stoi");
LAB_0011af5f:
    std::__throw_out_of_range("stoi");
LAB_0011af6b:
    std::__throw_invalid_argument("stoi");
LAB_0011af77:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar6 != lVar6) || (*puVar5 == 0x22)) goto LAB_0011af5f;
    if (*puVar5 == 0) {
      *puVar5 = uVar2;
    }
    if ((Scene *)local_160._0_8_ != &local_150) {
      operator_delete((void *)local_160._0_8_);
    }
    local_1f8 = lVar6;
    std::__cxx11::string::string((string *)local_160,argv[2],(allocator *)&local_100);
    uVar9 = local_160._0_8_;
    uVar2 = *puVar5;
    *puVar5 = 0;
    __endptr = &local_1f0;
    lVar6 = strtol((char *)local_160._0_8_,(char **)__endptr,10);
    if (local_1f0.m_materials == (Material **)uVar9) goto LAB_0011af6b;
    if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*puVar5 == 0x22)) goto LAB_0011af77;
    if (*puVar5 == 0) {
      *puVar5 = uVar2;
    }
    if ((Scene *)local_160._0_8_ != &local_150) {
      operator_delete((void *)local_160._0_8_);
    }
    local_d8 = lVar6;
    std::__cxx11::string::string((string *)local_160,argv[3],(allocator *)&local_100);
    __endptr = (Scene *)local_160._0_8_;
    uVar2 = *puVar5;
    *puVar5 = 0;
    local_e0 = strtol((char *)local_160._0_8_,(char **)&local_1f0,10);
    if ((Scene *)local_1f0.m_materials != __endptr) {
      __endptr = &local_150;
      if ((local_e0 - 0x80000000U < 0xffffffff00000000) || (*puVar5 == 0x22)) goto LAB_0011af8f;
      if (*puVar5 == 0) {
        *puVar5 = uVar2;
      }
      if ((Scene *)local_160._0_8_ != __endptr) {
        operator_delete((void *)local_160._0_8_);
      }
      std::__cxx11::string::string((string *)&local_100,argv[5],(allocator *)local_160);
      lVar6 = local_1f8;
      std::__cxx11::string::string((string *)local_50,argv[4],&local_239);
      plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_170 = *puVar10;
        lStack_168 = plVar7[3];
        local_180 = &local_170;
      }
      else {
        local_170 = *puVar10;
        local_180 = (ulong *)*plVar7;
      }
      local_178 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::string((string *)&local_90,argv[1],&local_23a);
      uVar13 = 0xf;
      if (local_180 != &local_170) {
        uVar13 = local_170;
      }
      if (uVar13 < (ulong)(local_88 + local_178)) {
        uVar13 = 0xf;
        if (local_90 != local_80) {
          uVar13 = local_80[0];
        }
        if (uVar13 < (ulong)(local_88 + local_178)) goto LAB_0011a929;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_180);
      }
      else {
LAB_0011a929:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_90);
      }
      local_1a0 = &local_190;
      puVar1 = puVar8 + 2;
      if ((undefined8 *)*puVar8 == puVar1) {
        local_190 = *puVar1;
        uStack_188 = puVar8[3];
      }
      else {
        local_190 = *puVar1;
        local_1a0 = (undefined8 *)*puVar8;
      }
      local_198 = puVar8[1];
      *puVar8 = puVar1;
      puVar8[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_228 = *puVar10;
        lStack_220 = plVar7[3];
        local_238._0_8_ = &local_228;
      }
      else {
        local_228 = *puVar10;
        local_238._0_8_ = (ulong *)*plVar7;
      }
      local_238._8_8_ = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::string((string *)&local_b0,argv[2],&local_23b);
      uVar13 = 0xf;
      if ((ulong *)local_238._0_8_ != &local_228) {
        uVar13 = local_228;
      }
      if (uVar13 < (ulong)(local_a8 + local_238._8_8_)) {
        uVar13 = 0xf;
        if (local_b0 != local_a0) {
          uVar13 = local_a0[0];
        }
        if (uVar13 < (ulong)(local_a8 + local_238._8_8_)) goto LAB_0011aa5f;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,local_238._0_8_);
      }
      else {
LAB_0011aa5f:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append(local_238,(ulong)local_b0);
      }
      local_218._0_8_ = &local_208;
      puVar1 = puVar8 + 2;
      if ((undefined8 *)*puVar8 == puVar1) {
        local_208 = *puVar1;
        uStack_200 = puVar8[3];
      }
      else {
        local_208 = *puVar1;
        local_218._0_8_ = (undefined8 *)*puVar8;
      }
      local_218._8_8_ = puVar8[1];
      *puVar8 = puVar1;
      puVar8[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_218);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_1b0 = *puVar10;
        lStack_1a8 = plVar7[3];
        local_1c0._0_8_ = &local_1b0;
      }
      else {
        local_1b0 = *puVar10;
        local_1c0._0_8_ = (ulong *)*plVar7;
      }
      local_1c0._8_8_ = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::string((string *)&local_d0,argv[3],&local_23c);
      uVar13 = 0xf;
      if ((ulong *)local_1c0._0_8_ != &local_1b0) {
        uVar13 = local_1b0;
      }
      if (uVar13 < (ulong)(local_c8 + local_1c0._8_8_)) {
        uVar13 = 0xf;
        if (local_d0 != local_c0) {
          uVar13 = local_c0[0];
        }
        if ((ulong)(local_c8 + local_1c0._8_8_) <= uVar13) {
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,local_1c0._0_8_);
          goto LAB_0011abb7;
        }
      }
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append(local_1c0,(ulong)local_d0);
LAB_0011abb7:
      local_1f0.m_materials = (Material **)&local_1f0.m_textures;
      puVar1 = puVar8 + 2;
      if ((Texture ***)*puVar8 == (Texture ***)puVar1) {
        local_1f0.m_textures = (Texture **)*puVar1;
        local_1f0._24_8_ = puVar8[3];
      }
      else {
        local_1f0.m_textures = (Texture **)*puVar1;
        local_1f0.m_materials = (Material **)*puVar8;
      }
      local_1f0._8_8_ = puVar8[1];
      *puVar8 = puVar1;
      puVar8[1] = 0;
      *(undefined1 *)puVar1 = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
      pSVar11 = (Scene *)(puVar8 + 2);
      if ((Scene *)*puVar8 == pSVar11) {
        local_150.m_materials = pSVar11->m_materials;
        local_150._8_8_ = puVar8[3];
        local_160._0_8_ = __endptr;
      }
      else {
        local_150.m_materials = pSVar11->m_materials;
        local_160._0_8_ = (Scene *)*puVar8;
      }
      local_160._8_8_ = puVar8[1];
      *puVar8 = pSVar11;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append(local_160,(ulong)local_100._M_dataplus._M_p);
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_70.field_2._M_allocated_capacity = *psVar12;
        local_70.field_2._8_8_ = plVar7[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar12;
        local_70._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_70._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((Scene *)local_160._0_8_ != &local_150) {
        operator_delete((void *)local_160._0_8_);
      }
      if (local_1f0.m_materials != (Material **)&local_1f0.m_textures) {
        operator_delete(local_1f0.m_materials);
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0);
      }
      if ((ulong *)local_1c0._0_8_ != &local_1b0) {
        operator_delete((void *)local_1c0._0_8_);
      }
      lVar3 = local_d8;
      if ((undefined8 *)local_218._0_8_ != &local_208) {
        operator_delete((void *)local_218._0_8_);
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0);
      }
      if ((ulong *)local_238._0_8_ != &local_228) {
        operator_delete((void *)local_238._0_8_);
      }
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0);
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      this = (Image2D *)operator_new(0x238);
      height = (int)lVar3;
      Image2D::Image2D(this,&local_70,&local_100,(int)lVar6,height);
      __seedval = time((time_t *)0x0);
      srand48(__seedval);
      local_1c0._0_4_ = 13.0;
      local_1c0._4_4_ = 4.0;
      local_1c0._8_4_ = 0x40800000;
      local_218._0_4_ = 0.0;
      local_218._4_4_ = 0.0;
      local_218._8_8_ = local_218._8_8_ & 0xffffffff00000000;
      local_238._0_4_ = 0.0;
      local_238._4_4_ = 1.0;
      local_238._8_8_ = local_238._8_8_ & 0xffffffff00000000;
      operator-((Vec3 *)local_1c0,(Vec3 *)local_218);
      width = (int)local_1f8;
      Camera::Camera((Camera *)local_160,(Vec3 *)local_1c0,(Vec3 *)local_218,(Vec3 *)local_238,20.0,
                     (float)width / (float)height,0.0,
                     SQRT((float)local_160._8_4_ * (float)local_160._8_4_ +
                          (float)local_160._0_4_ * (float)local_160._0_4_ +
                          (float)local_160._4_4_ * (float)local_160._4_4_),0.0,1.0);
      Scene::Scene(&local_1f0,500,500,500);
      list = Scene::Create(&local_1f0);
      compute_ray_tracing(width,height,(int)local_e0,(Camera *)local_160,list,this);
      Image2D::~Image2D(this);
      operator_delete(this);
      if (list != (Object *)0x0) {
        (*list->_vptr_Object[1])(list);
      }
      Scene::~Scene(&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      return 0;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0011af8f:
  uVar9 = std::__throw_out_of_range("stoi");
  if ((Scene *)local_70._M_dataplus._M_p != __endptr) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  _Unwind_Resume(uVar9);
}

Assistant:

int main (int argc, char *argv[])
{
    if (argc < 5) {
        std::cerr << "Usage: " << argv[0] << " width height samples filename\n";
        return 1;
    }

// Image
    const int         _width   = std::stoi(argv[1]);
    const int         _height  = std::stoi(argv[2]);
    const int         _samples = std::stoi(argv[3]);
	const std::string _type    = std::string(argv[5]);
    const std::string _name    = std::string(argv[4]) + "_" + std::string(argv[1]) + "_" + std::string(argv[2]) + "_" + std::string(argv[3]) + "." + _type;
	Image2D		     *_image   = new Image2D(_name, _type, _width, _height);

#ifdef RANDOM_SCENE
	INIT_RANDOM_GEN();
#endif

// Camera
    const Vec3  _origin         = Vec3(13.0f,  4.0f,  4.0f);
    const Vec3  _lookat         = Vec3( 0.0f,  0.0f,  0.0f);
    const Vec3  _up             = Vec3( 0.0f,  1.0f,  0.0f);
    const float _fov            = 20.0f;
    const float _aspect         = static_cast<float>(_width) / static_cast<float>(_height);
    const float _aperture       = 0.0f;
    const float _focus_distance = (_origin - _lookat).length();
    const float _shutter_open   = 0.0f;;
    const float _shutter_close  = 1.0f;;

    Camera _camera(_origin, _lookat, _up, _fov, _aspect, _aperture, _focus_distance, _shutter_open, _shutter_close);

// Scene
    Scene   _scene(500,500,500);
    Object *_objects_list = _scene.Create();

// Ray Tracing
	compute_ray_tracing(_width, _height, _samples, &_camera, _objects_list, _image);

// Clean
    safe_delete(_image);
    safe_delete(_objects_list);

    return 0;
}